

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monk.cpp
# Opt level: O0

void __thiscall Monk::Monk(Monk *this)

{
  shared_ptr<Position> *__args_2;
  int local_38 [5];
  undefined1 local_24 [20];
  Monk *local_10;
  Monk *this_local;
  
  local_10 = this;
  Hero::Hero(&this->super_Hero,0x14,0,-0x14,0,0x28,300);
  (this->super_Hero)._vptr_Hero = (_func_int **)&PTR__Monk_00143cf0;
  local_24._0_4_ = Hero::getDamage(&this->super_Hero);
  __args_2 = Hero::getPosition(&this->super_Hero);
  local_38[0] = 0;
  std::make_shared<HealStrike,int,std::shared_ptr<Position>const&,Strike::StrikeType,int>
            ((int *)(local_24 + 4),(shared_ptr<Position> *)local_24,(StrikeType *)__args_2,local_38)
  ;
  std::shared_ptr<Strike>::operator=
            (&(this->super_Hero).m_Strike,(shared_ptr<HealStrike> *)(local_24 + 4));
  std::shared_ptr<HealStrike>::~shared_ptr((shared_ptr<HealStrike> *)(local_24 + 4));
  (this->super_Hero).m_Class = MONK;
  return;
}

Assistant:

Monk::Monk() : Hero(20, 0, -20, 0, 40, 300)
{
    m_Strike = std::make_shared<HealStrike>(
            getDamage(), getPosition(), Strike::StrikeType::ALIAS, 1);
    m_Class = Hero::Class::MONK;
}